

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inst.cpp
# Opt level: O3

InstId asmjit::v1_14::InstAPI::stringToInstId(Arch arch,char *s,size_t len)

{
  InstId IVar1;
  
  if ((byte)(arch - k32BitMask) < 2) {
    IVar1 = x86::InstInternal::stringToInstId(s,len);
    return IVar1;
  }
  if ((arch != kAArch64_BE) && (arch != kAArch64)) {
    return 0;
  }
  IVar1 = a64::InstInternal::stringToInstId(s,len);
  return IVar1;
}

Assistant:

InstId InstAPI::stringToInstId(Arch arch, const char* s, size_t len) noexcept {
#if !defined(ASMJIT_NO_X86)
  if (Environment::isFamilyX86(arch))
    return x86::InstInternal::stringToInstId(s, len);
#endif

#if !defined(ASMJIT_NO_AARCH64)
  if (Environment::isFamilyAArch64(arch))
    return a64::InstInternal::stringToInstId(s, len);
#endif

  return 0;
}